

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::CommitParser::ParsePerson(CommitParser *this,char *str,Person *person)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  char *email_last;
  char *email_first;
  char *name_last;
  char *name_first;
  char *c;
  Person *person_local;
  char *str_local;
  CommitParser *this_local;
  
  name_first = str;
  c = (char *)person;
  person_local = (Person *)str;
  str_local = (char *)this;
  while( true ) {
    bVar5 = false;
    if (*name_first != '\0') {
      iVar2 = isspace((int)*name_first);
      bVar5 = iVar2 != 0;
    }
    pcVar1 = name_first;
    if (!bVar5) break;
    name_first = name_first + 1;
  }
  while( true ) {
    bVar5 = false;
    if (*name_first != '\0') {
      bVar5 = *name_first != '<';
    }
    if (!bVar5) break;
    name_first = name_first + 1;
  }
  email_first = name_first;
  while( true ) {
    bVar5 = false;
    if (email_first != pcVar1) {
      iVar2 = isspace((int)email_first[-1]);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    email_first = email_first + -1;
  }
  std::__cxx11::string::assign(c,(ulong)pcVar1);
  pcVar1 = name_first;
  if (*name_first != '\0') {
    name_first = name_first + 1;
    pcVar1 = name_first;
  }
  while( true ) {
    bVar5 = false;
    if (*name_first != '\0') {
      bVar5 = *name_first != '>';
    }
    if (!bVar5) break;
    name_first = name_first + 1;
  }
  if (*name_first != '\0') {
    name_first = name_first + 1;
  }
  std::__cxx11::string::assign(c + 0x20,(ulong)pcVar1);
  uVar3 = strtoul(name_first,&name_first,10);
  *(ulong *)(c + 0x40) = uVar3;
  lVar4 = strtol(name_first,&name_first,10);
  *(long *)(c + 0x48) = lVar4;
  return;
}

Assistant:

void ParsePerson(const char* str, Person& person)
  {
    // Person Name <person@domain.com> 1234567890 +0000
    const char* c = str;
    while (*c && isspace(*c)) {
      ++c;
    }

    const char* name_first = c;
    while (*c && *c != '<') {
      ++c;
    }
    const char* name_last = c;
    while (name_last != name_first && isspace(*(name_last - 1))) {
      --name_last;
    }
    person.Name.assign(name_first, name_last - name_first);

    const char* email_first = *c ? ++c : c;
    while (*c && *c != '>') {
      ++c;
    }
    const char* email_last = *c ? c++ : c;
    person.EMail.assign(email_first, email_last - email_first);

    person.Time = strtoul(c, const_cast<char**>(&c), 10);
    person.TimeZone = strtol(c, const_cast<char**>(&c), 10);
  }